

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O0

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)2>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  reference pcVar1;
  reference pcVar2;
  cell *pcVar3;
  cell *this;
  cell *val;
  cell *var;
  SchemeFrame *frame_local;
  const_iterator it_local;
  
  frame_local = (SchemeFrame *)it._M_current;
  pcVar1 = __gnu_cxx::
           __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                        *)&frame_local);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  pcVar2 = __gnu_cxx::
           __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ::operator*((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                        *)&frame_local);
  __gnu_cxx::
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  ::operator++((__normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
                *)&frame_local);
  pcVar3 = cell::operator=(&(frame->
                            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                            ).result,pcVar2);
  this = SchemeFrame::lookup(frame,&pcVar1->val);
  cell::operator=(this,pcVar3);
  return true;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &var = *it; ++it;
		const cell &val = *it; ++it;
		frame.lookup(var.val) = frame.result = val;
		return true;
	}